

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O0

time_point __thiscall ztimer::TimerManager::Str2Time(TimerManager *this,string *timePoint)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  tm date;
  vector<int,_std::allocator<int>_> futureTime;
  string *in_stack_000000d0;
  TimerManager *in_stack_000000d8;
  value_type local_78;
  value_type local_74;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa0;
  vector<int,_std::allocator<int>_> local_30;
  duration local_8;
  
  TimePointValid(in_stack_000000d8,in_stack_000000d0);
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(in_stack_ffffffffffffffa0);
  if (bVar1) {
    std::chrono::
    time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  }
  else {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,0);
    iVar2 = *pvVar4 + -0x76c;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,1);
    iVar3 = *pvVar4 + -1;
    std::vector<int,_std::allocator<int>_>::operator[](&local_30,2);
    std::vector<int,_std::allocator<int>_>::operator[](&local_30,3);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,4);
    local_74 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,5);
    local_78 = *pvVar4;
    mktime((tm *)&local_78);
    local_8.__r = (rep)std::chrono::_V2::system_clock::from_time_t(CONCAT44(iVar2,iVar3));
  }
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffffa0);
  return (time_point)(duration)local_8.__r;
}

Assistant:

std::chrono::system_clock::time_point TimerManager::Str2Time(const std::string& timePoint)
    {
        auto futureTime = TimePointValid(timePoint);
        if (futureTime.empty()) {
            return {};
        }
        std::tm date;
        date.tm_year = futureTime[0] - 1900;
        date.tm_mon = futureTime[1] - 1;
        date.tm_mday = futureTime[2];
        date.tm_hour = futureTime[3];
        date.tm_min = futureTime[4];
        date.tm_sec = futureTime[5];
        return std::chrono::system_clock::from_time_t(std::mktime(&date));
    }